

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::CeilCase::getInputValues(CeilCase *this,int numValues,void **values)

{
  pointer pSVar1;
  void *pvVar2;
  deUint32 dVar3;
  int iVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  uint uVar6;
  int ndx;
  ulong uVar7;
  float fVar8;
  Vec2 ranges [3];
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_6e;
  float local_6c;
  float local_68;
  Float<unsigned_int,_8,_23,_127,_3U> local_64;
  ulong local_60;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar3 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3 ^ 0xac23f);
  pSVar1 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (ulong)(pSVar1->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  uVar6 = iVar4 * numValues;
  if (0 < (int)uVar6) {
    local_68 = local_58[local_60 * 2];
    pvVar2 = *values;
    local_6c = local_58[local_60 * 2 + 1] - local_68;
    uVar7 = 0;
    do {
      fVar8 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar2 + uVar7 * 4) = fVar8 * local_6c + local_68;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (0 < (int)uVar6 && (int)local_60 == 1) {
    uVar7 = 0;
    do {
      local_64.m_value = *(StorageType_conflict *)((long)*values + uVar7 * 4);
      local_6e.m_value = 0;
      local_6e = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_64)
      ;
      FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_6e);
      *(StorageType_conflict *)((long)*values + uVar7 * 4) = FVar5.m_value;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0], numValues*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}